

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

filtration_algorithm_t * get_custom_filtration_computer(string *algorithm)

{
  bool bVar1;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    local_8 = (filtration_algorithm_t *)operator_new(8);
    memset(local_8,0,8);
    dimension_filtration::dimension_filtration((dimension_filtration *)in_stack_ffffffffffffff90);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      local_8 = (filtration_algorithm_t *)operator_new(8);
      memset(local_8,0,8);
      zero_filtration::zero_filtration((zero_filtration *)in_stack_ffffffffffffff90);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar1) {
        local_8 = (filtration_algorithm_t *)operator_new(8);
        memset(local_8,0,8);
        max_filtration::max_filtration((max_filtration *)in_stack_ffffffffffffff90);
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        if (bVar1) {
          local_8 = (filtration_algorithm_t *)operator_new(8);
          memset(local_8,0,8);
          max3_filtration::max3_filtration((max3_filtration *)in_stack_ffffffffffffff90);
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          if (bVar1) {
            local_8 = (filtration_algorithm_t *)operator_new(8);
            memset(local_8,0,8);
            max_plus_one_filtration::max_plus_one_filtration
                      ((max_plus_one_filtration *)in_stack_ffffffffffffff90);
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            if (bVar1) {
              local_8 = (filtration_algorithm_t *)operator_new(8);
              memset(local_8,0,8);
              product_filtration::product_filtration
                        ((product_filtration *)in_stack_ffffffffffffff90);
            }
            else {
              bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              if (bVar1) {
                local_8 = (filtration_algorithm_t *)operator_new(8);
                memset(local_8,0,8);
                sum_filtration::sum_filtration((sum_filtration *)in_stack_ffffffffffffff90);
              }
              else {
                bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                if (bVar1) {
                  local_8 = (filtration_algorithm_t *)operator_new(8);
                  memset(local_8,0,8);
                  pmean_filtration::pmean_filtration((pmean_filtration *)in_stack_ffffffffffffff90);
                }
                else {
                  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                  if (bVar1) {
                    local_8 = (filtration_algorithm_t *)operator_new(8);
                    memset(local_8,0,8);
                    pmoment_filtration::pmoment_filtration
                              ((pmoment_filtration *)in_stack_ffffffffffffff90);
                  }
                  else {
                    bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                    if (bVar1) {
                      local_8 = (filtration_algorithm_t *)operator_new(8);
                      memset(local_8,0,8);
                      remove_edges_filtration::remove_edges_filtration
                                ((remove_edges_filtration *)in_stack_ffffffffffffff90);
                    }
                    else {
                      bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                      if (bVar1) {
                        local_8 = (filtration_algorithm_t *)operator_new(8);
                        memset(local_8,0,8);
                        vertex_degree_filtration::vertex_degree_filtration
                                  ((vertex_degree_filtration *)local_8);
                      }
                      else {
                        local_8 = (filtration_algorithm_t *)0x0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

filtration_algorithm_t* get_custom_filtration_computer(std::string algorithm) {
	if (algorithm == "dimension") return new dimension_filtration();
	if (algorithm == "zero") return new zero_filtration();
	if (algorithm == "max") return new max_filtration();
	if (algorithm == "max3") return new max3_filtration();
	if (algorithm == "max_plus_one") return new max_plus_one_filtration();
	if (algorithm == "product") return new product_filtration();
	if (algorithm == "sum") return new sum_filtration();
	if (algorithm == "pmean") return new pmean_filtration();
	if (algorithm == "pmoment") return new pmoment_filtration();
	if (algorithm == "remove_edges") return new remove_edges_filtration();
	if (algorithm == "vertex_degree") return new vertex_degree_filtration();

	return nullptr;
}